

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall CppJieba::Trie::loadDict(Trie *this,char *filePath)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  Trie *in_RDI;
  string *in_stack_000000b8;
  bool res;
  char *in_stack_000001f0;
  Trie *in_stack_000001f8;
  char *local_160;
  char *local_148;
  char *local_130;
  char *local_100;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [16];
  Trie *in_stack_ffffffffffffff78;
  allocator local_71;
  string local_70 [24];
  string local_38 [32];
  char *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = _getInitFlag(in_RDI);
  pcVar2 = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar2,&local_71);
    bVar1 = Limonp::checkFileExist(in_stack_000000b8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_9a = 0;
      local_9a = _trieInsert(in_stack_000001f8,in_stack_000001f0);
      if ((bool)local_9a) {
        local_9a = _countWeight(in_stack_ffffffffffffff78);
        if ((bool)local_9a) {
          local_1 = true;
        }
        else {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            local_160 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
            ;
          }
          else {
            local_160 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                                ,0x2f);
            local_160 = local_160 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"_countWeight failed.",&local_e9);
          Limonp::Logger::LoggingF(3,local_160,0x95,(string *)local_e8);
          std::__cxx11::string::~string(local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          local_1 = false;
        }
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_148 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
        }
        else {
          local_148 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                              ,0x2f);
          local_148 = local_148 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"_trieInsert failed.",&local_c1);
        Limonp::Logger::LoggingF(3,local_148,0x8f,(string *)local_c0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        local_1 = false;
      }
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_130 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
      }
      else {
        local_130 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                            ,0x2f);
        local_130 = local_130 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"cann\'t find fiel[%s].",&local_99);
      Limonp::Logger::LoggingF(3,local_130,0x88,(string *)local_98,local_18);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      local_1 = false;
    }
  }
  else {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
    }
    else {
      local_100 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                          ,0x2f);
      local_100 = local_100 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"not initted.",(allocator *)&stack0xffffffffffffffc7);
    Limonp::Logger::LoggingF(3,local_100,0x82,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool loadDict(const char * const filePath)
            {
                if(!_getInitFlag())
                {
                    LogError("not initted.");
                    return false;
                }

                if(!checkFileExist(filePath))
                {
                    LogError("cann't find fiel[%s].",filePath);
                    return false;
                }
                bool res = false;
                res = _trieInsert(filePath);
                if(!res)
                {
                    LogError("_trieInsert failed.");
                    return false;
                }
                res = _countWeight();
                if(!res)
                {
                    LogError("_countWeight failed.");
                    return false;
                }
                return true;
            }